

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIterator.cpp
# Opt level: O2

void write_itermeta(DatabaseName *target,uint64_t byte_offset,uint64_t file_offset,
                   uint64_t total_files,DatabaseName *backing_storage)

{
  value_t vVar1;
  json_value jVar2;
  reference pvVar3;
  ostream *poVar4;
  json iter_json;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_3a0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_390;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_380;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_370;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_360;
  path local_350;
  path local_310;
  DatabaseName tmp_name;
  ofstream iter_file;
  undefined8 auStack_220 [62];
  
  DatabaseName::derive_temporary(&tmp_name,target);
  std::ofstream::ofstream(&iter_file);
  std::ios::exceptions((int)&iter_file + (int)*(undefined8 *)(_iter_file + -0x18));
  DatabaseName::get_full_path_abi_cxx11_(&local_350,&tmp_name);
  std::ofstream::open((char *)&iter_file,(_Ios_Openmode)local_350._M_pathname._M_dataplus._M_p);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_350);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(&iter_json,(nullptr_t)0x0);
  local_370.m_type = number_unsigned;
  local_370.m_value = (json_value)byte_offset;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&iter_json,"byte_offset");
  local_370.m_type = pvVar3->m_type;
  pvVar3->m_type = number_unsigned;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).number_unsigned = (number_unsigned_t)local_370.m_value;
  local_370.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_370);
  local_380.m_type = number_unsigned;
  local_380.m_value = (json_value)file_offset;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&iter_json,"file_offset");
  local_380.m_type = pvVar3->m_type;
  pvVar3->m_type = number_unsigned;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).number_unsigned = (number_unsigned_t)local_380.m_value;
  local_380.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_380);
  local_390.m_type = number_unsigned;
  local_390.m_value = (json_value)total_files;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&iter_json,"total_files");
  local_390.m_type = pvVar3->m_type;
  pvVar3->m_type = number_unsigned;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).number_unsigned = (number_unsigned_t)local_390.m_value;
  local_390.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_390);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_360,&backing_storage->filename);
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&iter_json,"backing_storage");
  vVar1 = pvVar3->m_type;
  pvVar3->m_type = local_360.m_type;
  jVar2 = pvVar3->m_value;
  pvVar3->m_value = local_360.m_value;
  local_360.m_type = vVar1;
  local_360.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_360);
  local_3a0.m_value.number_integer = time((time_t *)0x0);
  local_3a0.m_type = number_integer;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)&iter_json,"last_read_timestamp");
  local_3a0.m_type = pvVar3->m_type;
  pvVar3->m_type = number_integer;
  jVar2 = pvVar3->m_value;
  (pvVar3->m_value).number_integer = (number_integer_t)local_3a0.m_value;
  local_3a0.m_value = jVar2;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_3a0);
  *(undefined8 *)((long)auStack_220 + *(long *)(_iter_file + -0x18)) = 4;
  poVar4 = nlohmann::operator<<((ostream *)&iter_file,&iter_json);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::ofstream::close();
  DatabaseName::get_full_path_abi_cxx11_(&local_350,&tmp_name);
  DatabaseName::get_full_path_abi_cxx11_(&local_310,target);
  std::experimental::filesystem::v1::rename(&local_350,&local_310);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_310);
  std::experimental::filesystem::v1::__cxx11::path::~path(&local_350);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&iter_json);
  std::ofstream::~ofstream(&iter_file);
  DatabaseName::~DatabaseName(&tmp_name);
  return;
}

Assistant:

void write_itermeta(const DatabaseName &target, uint64_t byte_offset,
                    uint64_t file_offset, uint64_t total_files,
                    const DatabaseName &backing_storage) {
    DatabaseName tmp_name = target.derive_temporary();
    std::ofstream iter_file;
    iter_file.exceptions(std::ofstream::badbit);
    iter_file.open(tmp_name.get_full_path(), std::ofstream::binary);

    json iter_json;
    iter_json["byte_offset"] = byte_offset;
    iter_json["file_offset"] = file_offset;
    iter_json["total_files"] = total_files;
    iter_json["backing_storage"] = backing_storage.get_filename();
    iter_json["last_read_timestamp"] = std::time(nullptr);

    iter_file << std::setw(4) << iter_json << std::endl;
    iter_file.close();

    fs::rename(tmp_name.get_full_path(), target.get_full_path());
}